

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

void __thiscall indigox::Molecule::RemoveAtom(Molecule *this,Atom_p *a)

{
  map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
  *this_00;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *__x;
  element_type *this_01;
  element_type *peVar1;
  undefined8 uVar2;
  element_type *peVar3;
  Molecule *pMVar4;
  AtomBondIterator AVar5;
  AtomBondIterator AVar6;
  mapped_type *ppvVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  Atom_p hit;
  Bond_p tmp;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_88 [16];
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Molecule *local_60;
  const_iterator local_58;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  Atom::GetMolecule((Atom *)&local_98);
  std::__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<indigox::Molecule,void>
            ((__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x10),
             (__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<indigox::Molecule>);
  peVar3 = local_78._M_ptr;
  peVar1 = local_98._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  if (peVar1 == (element_type *)peVar3) {
    local_58._M_current =
         (shared_ptr<indigox::Atom> *)
         std::
         __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<indigox::Atom>*,std::vector<std::shared_ptr<indigox::Atom>,std::allocator<std::shared_ptr<indigox::Atom>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<indigox::Atom>const>>
                   ((this->atoms_).
                    super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (this->atoms_).
                    super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,a);
    if (local_58._M_current !=
        (this->atoms_).
        super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_98,
                 (__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *)local_58._M_current);
      AVar5 = Atom::BeginBond(local_98._M_ptr);
      local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->atoms_;
      __x = (__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x10);
      local_60 = this;
      while( true ) {
        AVar6 = Atom::EndBond(local_98._M_ptr);
        if (AVar5._M_current == AVar6._M_current) break;
        std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (__x,AVar5._M_current);
        std::
        _Rb_tree<std::shared_ptr<indigox::Bond>,_std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
        ::erase(&(this->bond_to_edge_)._M_t,(key_type *)__x);
        Bond::GetSourceAtom((Bond *)local_88);
        uVar2 = local_88._0_8_;
        peVar1 = local_98._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
        if ((element_type *)uVar2 == peVar1) {
          Bond::GetTargetAtom((Bond *)local_88);
          uVar2 = local_88._0_8_;
          std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x38),
                     __x);
          Atom::RemoveBond((Atom *)uVar2,(Bond_p *)(local_88 + 0x38));
          this_02 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x40);
        }
        else {
          Bond::GetSourceAtom((Bond *)local_88);
          uVar2 = local_88._0_8_;
          std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x48),
                     __x);
          Atom::RemoveBond((Atom *)uVar2,(Bond_p *)(local_88 + 0x48));
          this_02 = &local_40._M_refcount;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_02);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
        Bond::Clear(local_78._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18));
        AVar5._M_current = AVar5._M_current + 1;
      }
      std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
      ::erase((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
               *)local_68._M_pi,local_58);
      pMVar4 = local_60;
      this_01 = (local_60->graph_).
                super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = &local_60->atom_to_vertex_;
      ppvVar7 = std::
                map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                ::at(this_00,(key_type *)&local_98);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      RemoveVertex(&this_01->super__MolGraph,*ppvVar7);
      std::
      _Rb_tree<std::shared_ptr<indigox::Atom>,_std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
      ::erase(&this_00->_M_t,(key_type *)&local_98);
      Atom::Clear(local_98._M_ptr);
      pMVar4->modified_ = true;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    }
  }
  return;
}

Assistant:

void Molecule::RemoveAtom(Atom_p a) {
  if (a->GetMolecule() != shared_from_this()) return;
  auto it = std::find(atoms_.begin(), atoms_.end(), a);
  if (it != atoms_.end()) {
    Atom_p hit = *it;
    for (AtomBondIterator bs = hit->BeginBond(); bs != hit->EndBond(); ++bs) {
      Bond_p tmp = bs->lock();
      bond_to_edge_.erase(tmp);
      if (tmp->GetSourceAtom() != hit) tmp->GetSourceAtom()->RemoveBond(tmp);
      else tmp->GetTargetAtom()->RemoveBond(tmp);
      tmp->Clear();
    }
    atoms_.erase(it);
    graph_->RemoveVertex(atom_to_vertex_.at(hit));
    atom_to_vertex_.erase(hit);
    hit->Clear();
    modified_ = true;
  }
}